

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall boost::runtime::param_error::~param_error(param_error *this)

{
  param_error *in_RDI;
  
  ~param_error(in_RDI);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

~param_error() BOOST_NOEXCEPT_OR_NOTHROW {}